

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O3

int igsc_image_oprom_supported_devices_typed
              (igsc_oprom_image *img,uint32_t request_type,igsc_oprom_device_info_4ids *device,
              uint32_t *count)

{
  long lVar1;
  igsc_oprom_type iVar2;
  uint uVar3;
  int iVar4;
  igsc_log_func_t p_Var5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((count == (uint32_t *)0x0 ||
       (device == (igsc_oprom_device_info_4ids *)0x0 || img == (igsc_oprom_image *)0x0)) ||
     (*count == 0)) {
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      iVar8 = 3;
      syslog(3,"%s: IGSC: (%s:%s():%d) bad parameters\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
             "igsc_image_oprom_supported_devices_typed",0x110);
      goto LAB_00117773;
    }
    p_Var5 = igsc_get_log_callback_func();
    pcVar6 = gsc_time(__time_buf,0x80);
    (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) bad parameters\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
              "igsc_image_oprom_supported_devices_typed",0x110);
  }
  else {
    if (0xfffffffd < request_type - 3) {
      iVar2 = image_oprom_get_type(img);
      uVar9 = (ulong)iVar2;
      if ((iVar2 & request_type) == IGSC_OPROM_NONE) {
        p_Var5 = igsc_get_log_callback_func();
        if (p_Var5 == (igsc_log_func_t)0x0) {
          pcVar6 = gsc_time(__time_buf,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) request type %u does not match image type %u \n",pcVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                 "igsc_image_oprom_supported_devices_typed",0x11c,request_type,uVar9);
        }
        else {
          p_Var5 = igsc_get_log_callback_func();
          pcVar6 = gsc_time(__time_buf,0x80);
          (*p_Var5)(IGSC_LOG_LEVEL_ERROR,
                    "%s: IGSC: (%s:%s():%d) request type %u does not match image type %u \n",pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                    "igsc_image_oprom_supported_devices_typed",0x11c,request_type,uVar9);
        }
        iVar8 = 9;
      }
      else {
        uVar3 = igsc_get_log_level();
        if (uVar3 != 0) {
          p_Var5 = igsc_get_log_callback_func();
          if (p_Var5 == (igsc_log_func_t)0x0) {
            pcVar6 = gsc_time(__time_buf,0x80);
            syslog(7,"%s: IGSC: (%s:%s():%d) img_type %u, request_type = %u\n",pcVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                   "igsc_image_oprom_supported_devices_typed",0x120,uVar9,request_type);
          }
          else {
            p_Var5 = igsc_get_log_callback_func();
            pcVar6 = gsc_time(__time_buf,0x80);
            (*p_Var5)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) img_type %u, request_type = %u\n"
                      ,pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                      "igsc_image_oprom_supported_devices_typed",0x120,uVar9,request_type);
          }
        }
        uVar9 = 0;
        do {
          uVar7 = uVar9;
          iVar4 = image_oprom_get_next_4ids(img,request_type,device);
          if (iVar4 != 0) {
            iVar8 = 0;
            if (iVar4 != 4) {
              iVar8 = iVar4;
            }
            goto LAB_00117728;
          }
          uVar9 = uVar7 + 1;
          device = device + 1;
        } while (uVar9 < *count);
        iVar8 = 0;
LAB_00117728:
        *count = (int)uVar7 + 1;
      }
      goto LAB_00117773;
    }
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      iVar8 = 3;
      syslog(3,"%s: IGSC: (%s:%s():%d) request_type %u is not supported\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
             "igsc_image_oprom_supported_devices_typed",0x115,request_type);
      goto LAB_00117773;
    }
    p_Var5 = igsc_get_log_callback_func();
    pcVar6 = gsc_time(__time_buf,0x80);
    (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) request_type %u is not supported\n",
              pcVar6,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
              "igsc_image_oprom_supported_devices_typed",0x115,request_type);
  }
  iVar8 = 3;
LAB_00117773:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int igsc_image_oprom_supported_devices_typed(IN struct igsc_oprom_image *img,
                                             IN uint32_t request_type,
                                             OUT struct igsc_oprom_device_info_4ids *device,
                                             IN OUT uint32_t *count)
{
    int ret;
    uint32_t pos = 0;
    enum igsc_oprom_type img_type;

    if (img == NULL || device == NULL || count == NULL || *count == 0)
    {
        gsc_error("bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }
    if (request_type != IGSC_OPROM_DATA && request_type != IGSC_OPROM_CODE)
    {
        gsc_error("request_type %u is not supported\n", request_type);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    img_type = image_oprom_get_type(img);
    if ((img_type & request_type) == 0)
    {
        gsc_error("request type %u does not match image type %u \n", request_type, img_type);
        return IGSC_ERROR_NOT_SUPPORTED;
    }

    gsc_debug("img_type %u, request_type = %u\n", img_type, request_type);

    do
    {
        ret = image_oprom_get_next_4ids(img, request_type, &device[pos++]);
    }
    while (ret == IGSC_SUCCESS && pos < *count);

    if (ret == IGSC_ERROR_DEVICE_NOT_FOUND)
    {
        ret = IGSC_SUCCESS;
    }
    *count = pos;

    return ret;
}